

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_resources_get_builtin_resource_list_for_type
          (spvc_resources resources,spvc_builtin_resource_type type,
          spvc_reflected_builtin_resource **resource_list,size_t *resource_size)

{
  spvc_context this;
  SmallVector<spvc_reflected_builtin_resource,_8UL> *pSVar1;
  spvc_result sVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT) {
    pSVar1 = &resources->builtin_outputs;
  }
  else if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT) {
    pSVar1 = &resources->builtin_inputs;
  }
  else {
    pSVar1 = (SmallVector<spvc_reflected_builtin_resource,_8UL> *)0x0;
  }
  if (pSVar1 == (SmallVector<spvc_reflected_builtin_resource,_8UL> *)0x0) {
    this = resources->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Invalid argument.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    *resource_size = (pSVar1->super_VectorView<spvc_reflected_builtin_resource>).buffer_size;
    *resource_list = (pSVar1->super_VectorView<spvc_reflected_builtin_resource>).ptr;
    sVar2 = SPVC_SUCCESS;
  }
  return sVar2;
}

Assistant:

spvc_result spvc_resources_get_builtin_resource_list_for_type(
		spvc_resources resources, spvc_builtin_resource_type type,
		const spvc_reflected_builtin_resource **resource_list,
		size_t *resource_size)
{
	const SmallVector<spvc_reflected_builtin_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->builtin_inputs;
		break;

	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->builtin_outputs;
		break;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}